

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixSync(sqlite3_file *id,int flags)

{
  byte *pbVar1;
  int iVar2;
  uint *puVar3;
  sqlite3_io_methods *psVar4;
  int dirfd;
  int local_14;
  
  iVar2 = fsync(*(int *)&id[3].pMethods);
  if (iVar2 == 0) {
    iVar2 = 0;
    if (((ulong)id[3].pMethods & 0x8000000000000) != 0) {
      iVar2 = (*aSyscall[0x11].pCurrent)(id[7].pMethods,&local_14);
      if (iVar2 == 0) {
        fsync(local_14);
        robust_close((unixFile *)id,local_14,0x9de8);
      }
      pbVar1 = (byte *)((long)&id[3].pMethods + 6);
      *pbVar1 = *pbVar1 & 0xf7;
      iVar2 = 0;
    }
  }
  else {
    puVar3 = (uint *)__errno_location();
    *(uint *)&id[4].pMethods = *puVar3;
    psVar4 = id[7].pMethods;
    if (psVar4 == (sqlite3_io_methods *)0x0) {
      psVar4 = (sqlite3_io_methods *)0x1e8ba9;
    }
    sqlite3_log(0x40a,"os_unix.c:%d: (%d) %s(%s) - %s",0x9dda,(ulong)*puVar3,"full_fsync",psVar4,"")
    ;
    iVar2 = 0x40a;
  }
  return iVar2;
}

Assistant:

static int unixSync(sqlite3_file *id, int flags){
  int rc;
  unixFile *pFile = (unixFile*)id;

  int isDataOnly = (flags&SQLITE_SYNC_DATAONLY);
  int isFullsync = (flags&0x0F)==SQLITE_SYNC_FULL;

  /* Check that one of SQLITE_SYNC_NORMAL or FULL was passed */
  assert((flags&0x0F)==SQLITE_SYNC_NORMAL
      || (flags&0x0F)==SQLITE_SYNC_FULL
  );

  /* Unix cannot, but some systems may return SQLITE_FULL from here. This
  ** line is to test that doing so does not cause any problems.
  */
  SimulateDiskfullError( return SQLITE_FULL );

  assert( pFile );
  OSTRACE(("SYNC    %-3d\n", pFile->h));
  rc = full_fsync(pFile->h, isFullsync, isDataOnly);
  SimulateIOError( rc=1 );
  if( rc ){
    storeLastErrno(pFile, errno);
    return unixLogError(SQLITE_IOERR_FSYNC, "full_fsync", pFile->zPath);
  }

  /* Also fsync the directory containing the file if the DIRSYNC flag
  ** is set.  This is a one-time occurrence.  Many systems (examples: AIX)
  ** are unable to fsync a directory, so ignore errors on the fsync.
  */
  if( pFile->ctrlFlags & UNIXFILE_DIRSYNC ){
    int dirfd;
    OSTRACE(("DIRSYNC %s (have_fullfsync=%d fullsync=%d)\n", pFile->zPath,
            HAVE_FULLFSYNC, isFullsync));
    rc = osOpenDirectory(pFile->zPath, &dirfd);
    if( rc==SQLITE_OK ){
      full_fsync(dirfd, 0, 0);
      robust_close(pFile, dirfd, __LINE__);
    }else{
      assert( rc==SQLITE_CANTOPEN );
      rc = SQLITE_OK;
    }
    pFile->ctrlFlags &= ~UNIXFILE_DIRSYNC;
  }
  return rc;
}